

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::writeSubDirs(MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int flags;
  MakefileGenerator *in_stack_00000048;
  QList<MakefileGenerator::SubTarget_*> targets;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QString *in_stack_ffffffffffffff70;
  QMakeProject *in_stack_ffffffffffffff78;
  undefined1 *puVar2;
  undefined4 local_64;
  long *ch;
  undefined1 local_50 [48];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  ch = in_RDI;
  findSubDirsSubTargets(in_stack_00000048);
  QTextStream::operator<<(in_RSI,"first: make_first\n");
  local_64 = 1;
  QString::QString((QString *)in_stack_ffffffffffffff78,(char *)ch);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (bool)in_stack_ffffffffffffff6f);
  QString::~QString((QString *)0x19a68e);
  if (bVar1) {
    local_64 = 3;
  }
  puVar2 = local_50;
  QList<MakefileGenerator::SubTarget_*>::QList
            ((QList<MakefileGenerator::SubTarget_*> *)in_RSI,
             (QList<MakefileGenerator::SubTarget_*> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  (**(code **)(*in_RDI + 0x48))(in_RDI,in_RSI,puVar2,local_64);
  QList<MakefileGenerator::SubTarget_*>::~QList((QList<MakefileGenerator::SubTarget_*> *)0x19a6ec);
  qDeleteAll<QList<MakefileGenerator::SubTarget*>>((QList<MakefileGenerator::SubTarget_*> *)in_RSI);
  QList<MakefileGenerator::SubTarget_*>::~QList((QList<MakefileGenerator::SubTarget_*> *)0x19a700);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeSubDirs(QTextStream &t)
{
    QList<SubTarget*> targets = findSubDirsSubTargets();
    t << "first: make_first\n";
    int flags = SubTargetInstalls;
    if(project->isActiveConfig("ordered"))
        flags |= SubTargetOrdered;
    writeSubTargets(t, targets, flags);
    qDeleteAll(targets);
}